

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall
FNodeBuilder::FVertexMap::FVertexMap
          (FVertexMap *this,FNodeBuilder *builder,fixed_t minx,fixed_t miny,fixed_t maxx,
          fixed_t maxy)

{
  int iVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  
  (this->super_IVertexMap)._vptr_IVertexMap = (_func_int **)&PTR__FVertexMap_006faf78;
  this->MyBuilder = builder;
  this->MinX = minx;
  this->MinY = miny;
  iVar1 = (int)((((double)maxx - (double)minx) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  this->BlocksWide = iVar1;
  iVar3 = (int)((((double)maxy - (double)miny) + 1.0 + 16777215.0) * 5.9604644775390625e-08);
  this->BlocksTall = iVar3;
  iVar4 = iVar3 * iVar1;
  this->MaxX = iVar1 * 0x1000000 + minx + -1;
  this->MaxY = miny + iVar3 * 0x1000000 + -1;
  __n = (long)iVar4 * 0x10;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = __n + 8;
  }
  plVar2 = (long *)operator_new__(uVar5);
  *plVar2 = (long)iVar4;
  if (iVar4 != 0) {
    memset((TArray<int,_int> *)(plVar2 + 1),0,__n);
  }
  this->VertexGrid = (TArray<int,_int> *)(plVar2 + 1);
  return;
}

Assistant:

FNodeBuilder::FVertexMap::FVertexMap (FNodeBuilder &builder,
	fixed_t minx, fixed_t miny, fixed_t maxx, fixed_t maxy)
	: MyBuilder(builder)
{
	MinX = minx;
	MinY = miny;
	BlocksWide = int(((double(maxx) - minx + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	BlocksTall = int(((double(maxy) - miny + 1) + (BLOCK_SIZE - 1)) / BLOCK_SIZE);
	MaxX = MinX + BlocksWide * BLOCK_SIZE - 1;
	MaxY = MinY + BlocksTall * BLOCK_SIZE - 1;
	VertexGrid = new TArray<int>[BlocksWide * BlocksTall];
}